

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

int helicsDataBufferVectorSize(HelicsDataBuffer data)

{
  DataType DVar1;
  SmallBuffer *pSVar2;
  size_t sVar3;
  ulong uVar4;
  vector<double,_std::allocator<double>_> v;
  data_view local_28;
  
  pSVar2 = getBuffer(data);
  if (pSVar2 == (SmallBuffer *)0x0) {
    return 0;
  }
  DVar1 = helics::detail::detectType(pSVar2->heap);
  if ((uint)DVar1 < 8) {
    if ((0x86U >> (DVar1 & (HELICS_JSON|HELICS_DOUBLE)) & 1) != 0) {
      return 1;
    }
    if ((0x30U >> (DVar1 & (HELICS_JSON|HELICS_DOUBLE)) & 1) != 0) {
      sVar3 = helics::detail::getDataSize(pSVar2->heap);
      return (int)sVar3;
    }
    if (DVar1 == HELICS_COMPLEX) {
      return 2;
    }
  }
  v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_28.dblock._M_len = pSVar2->bufferSize;
  local_28.dblock._M_str = (char *)pSVar2->heap;
  local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  DVar1 = helics::detail::detectType((byte *)local_28.dblock._M_str);
  helics::valueExtract(&local_28,DVar1,&v);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  uVar4 = (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v.super__Vector_base<double,_std::allocator<double>_>);
  return (int)(uVar4 >> 3);
}

Assistant:

int helicsDataBufferVectorSize(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    switch (helics::detail::detectType(ptr->data())) {
        case helics::DataType::HELICS_VECTOR:
        case helics::DataType::HELICS_COMPLEX_VECTOR:
            return static_cast<int>(helics::detail::getDataSize(ptr->data()));
        case helics::DataType::HELICS_BOOL:
        case helics::DataType::HELICS_INT:
        case helics::DataType::HELICS_DOUBLE:
            return 1;
        case helics::DataType::HELICS_COMPLEX:
            return 2;
        default: {
            std::vector<double> v;
            helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);
            return static_cast<int>(v.size());
        } break;
    }
}